

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stage.cc
# Opt level: O0

optional<const_tinyusdz::Prim_*> *
tinyusdz::anon_unknown_28::GetPrimAtPathRec
          (optional<const_tinyusdz::Prim_*> *__return_storage_ptr__,Prim *parent,string *parent_path
          ,Path *path,uint32_t depth)

{
  __type _Var1;
  bool bVar2;
  Path *this;
  string *psVar3;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *this_00;
  value_type *value;
  optional<const_tinyusdz::Prim_*> local_118;
  undefined1 local_108 [8];
  optional<const_tinyusdz::Prim_*> pv;
  Prim *child;
  const_iterator __end2;
  const_iterator __begin2;
  vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_> *__range2;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90 [32];
  string local_70 [8];
  string elementName;
  string abs_path;
  uint32_t depth_local;
  Path *path_local;
  string *parent_path_local;
  Prim *parent_local;
  
  parent_path_local = (string *)parent;
  parent_local = (Prim *)__return_storage_ptr__;
  if (parent == (Prim *)0x0) {
    nonstd::optional_lite::optional<const_tinyusdz::Prim_*>::optional(__return_storage_ptr__);
  }
  else {
    ::std::__cxx11::string::string((string *)(elementName.field_2._M_local_buf + 8));
    this = Prim::element_path((Prim *)parent_path_local);
    psVar3 = Path::prim_part_abi_cxx11_(this);
    ::std::__cxx11::string::string(local_70,(string *)psVar3);
    ::std::operator+(local_b0,(char *)parent_path);
    ::std::operator+(local_90,local_b0);
    ::std::__cxx11::string::operator=
              ((string *)(elementName.field_2._M_local_buf + 8),(string *)local_90);
    ::std::__cxx11::string::~string((string *)local_90);
    ::std::__cxx11::string::~string((string *)local_b0);
    Path::full_path_name_abi_cxx11_(&local_d0,path);
    _Var1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&elementName.field_2 + 8),&local_d0);
    ::std::__cxx11::string::~string((string *)&local_d0);
    if (_Var1) {
      nonstd::optional_lite::optional<const_tinyusdz::Prim_*>::optional<const_tinyusdz::Prim_*,_0>
                (__return_storage_ptr__,(Prim **)&parent_path_local);
    }
    ::std::__cxx11::string::~string(local_70);
    if (!_Var1) {
      this_00 = Prim::children((Prim *)parent_path_local);
      __end2._M_current =
           (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::begin(this_00);
      child = (Prim *)std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>::end(this_00);
      while (bVar2 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                                         *)&child), bVar2) {
        pv.contained = (storage_t<const_tinyusdz::Prim_*>)
                       __gnu_cxx::
                       __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
                       ::operator*(&__end2);
        GetPrimAtPathRec(&local_118,(Prim *)pv.contained,(string *)((long)&elementName.field_2 + 8),
                         path,depth + 1);
        nonstd::optional_lite::optional<const_tinyusdz::Prim_*>::optional<const_tinyusdz::Prim_*,_0>
                  ((optional<const_tinyusdz::Prim_*> *)local_108,&local_118);
        nonstd::optional_lite::optional<const_tinyusdz::Prim_*>::~optional(&local_118);
        bVar2 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)local_108);
        if (bVar2) {
          value = nonstd::optional_lite::optional<const_tinyusdz::Prim_*>::value
                            ((optional<const_tinyusdz::Prim_*> *)local_108);
          nonstd::optional_lite::optional<const_tinyusdz::Prim_*>::
          optional<const_tinyusdz::Prim_*&,_0>(__return_storage_ptr__,value);
        }
        nonstd::optional_lite::optional<const_tinyusdz::Prim_*>::~optional
                  ((optional<const_tinyusdz::Prim_*> *)local_108);
        if (bVar2) goto LAB_00469b3c;
        __gnu_cxx::
        __normal_iterator<const_tinyusdz::Prim_*,_std::vector<tinyusdz::Prim,_std::allocator<tinyusdz::Prim>_>_>
        ::operator++(&__end2);
      }
      nonstd::optional_lite::optional<const_tinyusdz::Prim_*>::optional(__return_storage_ptr__);
    }
LAB_00469b3c:
    ::std::__cxx11::string::~string((string *)(elementName.field_2._M_local_buf + 8));
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<const Prim *> GetPrimAtPathRec(const Prim *parent,
                                                const std::string &parent_path,
                                                const Path &path,
                                                const uint32_t depth) {

  if (!parent) {
    return nonstd::nullopt;
  }

  std::string abs_path;
  // if (auto pv = GetPrimElementName(parent->data())) {
  {
    std::string elementName = parent->element_path().prim_part();
    // DCOUT(pprint::Indent(depth) << "Prim elementName = " << elementName);
    // DCOUT(pprint::Indent(depth) << "Given Path = " << path);
    //  fully absolute path
    abs_path = parent_path + "/" + elementName;
    // DCOUT(pprint::Indent(depth) << "abs_path = " << abs_path);
    // DCOUT(pprint::Indent(depth)
    //       << "queriying path = " << path.full_path_name());
    if (abs_path == path.full_path_name()) {
      // DCOUT(pprint::Indent(depth)
      //       << "Got it! Found Prim at Path = " << abs_path);
      return parent;
    }
  }

  // DCOUT(pprint::Indent(depth)
  //       << "# of children : " << parent->children().size());
  for (const auto &child : parent->children()) {
    // const std::string &p = parent->elementPath.full_path_name();
    // DCOUT(pprint::Indent(depth + 1) << "Parent path : " << abs_path);
    if (auto pv = GetPrimAtPathRec(&child, abs_path, path, depth + 1)) {
      return pv.value();
    }
  }

  return nonstd::nullopt;
}